

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall dynet::AdamTrainer::update_lookup_params(AdamTrainer *this,real gscale,size_t idx)

{
  initializer_list<dynet::Tensor_*> __l;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_> *this_00
  ;
  reference pvVar1;
  reference pvVar2;
  size_type in_RSI;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  value_type *p;
  vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *in_stack_ffffffffffffff80;
  allocator_type *__a;
  Tensor *this_01;
  undefined1 local_38 [24];
  const_reference local_20;
  size_type local_18;
  undefined4 local_c;
  
  local_18 = in_RSI;
  local_c = in_XMM0_Da;
  this_00 = ParameterCollection::lookup_parameters_list((ParameterCollection *)0xdb41b6);
  local_20 = std::
             vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
             ::operator[](this_00,local_18);
  __a = (allocator_type *)&(*local_20)->all_values;
  this_01 = &(*local_20)->all_grads;
  pvVar1 = std::
           vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
           operator[]((vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
                       *)(in_RDI + 0xb),local_18);
  pvVar2 = std::
           vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
           operator[]((vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
                       *)(in_RDI + 0x11),local_18);
  std::allocator<dynet::Tensor_*>::allocator((allocator<dynet::Tensor_*> *)0xdb4259);
  __l._M_len = (size_type)pvVar2;
  __l._M_array = (iterator)pvVar1;
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::vector
            ((vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *)this_01,__l,__a);
  (**(code **)(*in_RDI + 0x28))(local_c,in_RDI,local_38);
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::~vector(in_stack_ffffffffffffff80)
  ;
  std::allocator<dynet::Tensor_*>::~allocator((allocator<dynet::Tensor_*> *)0xdb42a3);
  return;
}

Assistant:

void AdamTrainer::update_lookup_params(real gscale, size_t idx) {
  auto & p = model->lookup_parameters_list()[idx];
  update_rule(gscale, {&p->all_values, &p->all_grads, &lm[idx].all_h, &lv[idx].all_h});
}